

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O1

string * __thiscall
booster::locale::util::gregorian_calendar::get_timezone_abi_cxx11_
          (string *__return_storage_ptr__,gregorian_calendar *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->time_zone_name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->time_zone_name_)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string get_timezone() const
            {
                return time_zone_name_;
            }